

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataGroup.cpp
# Opt level: O2

bool __thiscall DL::DataGroup::isAllAnonymousNumber(DataGroup *this)

{
  DataType *pDVar1;
  element_type *peVar2;
  pointer pDVar3;
  iterator __begin1;
  pointer pDVar4;
  bool bVar5;
  
  peVar2 = (this->mShared).super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    __assert_fail("(mShared)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataGroup.cpp"
                  ,0xc4,"bool DL::DataGroup::isAllAnonymousNumber() const");
  }
  pDVar4 = (peVar2->AnonymousData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar3 = *(pointer *)
            ((long)&(peVar2->AnonymousData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (pDVar4 == pDVar3) {
    bVar5 = false;
  }
  else {
    do {
      bVar5 = pDVar4 == pDVar3;
      if (bVar5) {
        return bVar5;
      }
      pDVar1 = &pDVar4->mType;
      pDVar4 = pDVar4 + 1;
    } while (*pDVar1 - DT_Integer < 2);
  }
  return bVar5;
}

Assistant:

bool DataGroup::isAllAnonymousNumber() const
{
	DL_ASSERT(mShared);

	if (mShared->AnonymousData.empty())
		return false;

	for (const Data& d : mShared->AnonymousData) {
		if (!d.isNumber())
			return false;
	}

	return true;
}